

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

StmtNode * __thiscall Parser::Stmt(Parser *this)

{
  uint uVar1;
  StmtNode *pSVar2;
  ExpNode *head;
  StmtNode *falseStmt;
  IfNode *this_00;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)this->tok;
  if (uVar3 < 0x39) {
    if ((0x1c03057cfe44400U >> (uVar3 & 0x3f) & 1) != 0) {
      pSVar2 = StmtAUX(this);
      return pSVar2;
    }
    if (uVar3 == 7) {
      Eat(this,7);
      EatOrSkip(this,0xe,stmtFollowSet);
      head = ExprAssign(this);
      EatOrSkip(this,0xf,stmtFollowSet);
      pSVar2 = Stmt(this);
      falseStmt = ElseStmt(this);
      this_00 = (IfNode *)operator_new(0x30);
      IfNode::IfNode(this_00,head,pSVar2,falseStmt);
      uVar1 = lexical_analyzer_getLine();
      (*(this_00->super_StmtNode).super_ASTNode._vptr_ASTNode[2])(this_00,(ulong)uVar1);
      return &this_00->super_StmtNode;
    }
  }
  Sync(this,this->tok,stmtFollowSet);
  return (StmtNode *)0x0;
}

Assistant:

StmtNode *Parser::Stmt() {
    switch (tok) {
        case IF: {
            Eat(IF);

            EatOrSkip(LPARENT, stmtFollowSet);
            ExpNode *exp = ExprAssign();
            EatOrSkip(RPARENT, stmtFollowSet);

            StmtNode *ifStmt = Stmt();
            StmtNode *elseStmt = ElseStmt();

            IfNode *stmt = new IfNode(exp, ifStmt, elseStmt);
            stmt->setLine(lexical_analyzer_getLine());


            return stmt;
        }

        case LITERALCHAR:
        case WHILE:
        case SWITCH:
        case BREAK:
        case PRINT:
        case READLN:
        case RETURN:
        case THROW:
        case LBRACE:
        case TRY:
        case NOT:
        case PLUS:
        case MINUS:
        case STAR:
        case ADDRESS:
        case ID:
        case NUMINT:
        case NUMFLOAT:
        case LITERAL:
        case TRUE:
        case FALSE:
        case LPARENT: {
            return StmtAUX();
        }
        default: {
            Sync(tok, stmtFollowSet);
        }
    }
    return nullptr;
}